

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

TimeProcessingResult __thiscall
helics::TimeDependencies::updateTime(TimeDependencies *this,ActionMessage *cmd)

{
  DependencyInfo *pDVar1;
  DependencyInfo *depInfo;
  DependencyInfo *in_stack_00000038;
  ActionMessage *in_stack_00000040;
  TimeProcessingResult local_1;
  
  pDVar1 = getDependencyInfo((TimeDependencies *)cmd,this._4_4_);
  if ((pDVar1 == (DependencyInfo *)0x0) || ((pDVar1->dependency & 1U) == 0)) {
    local_1 = NOT_PROCESSED;
  }
  else {
    local_1 = processMessage(in_stack_00000040,in_stack_00000038);
  }
  return local_1;
}

Assistant:

TimeProcessingResult TimeDependencies::updateTime(const ActionMessage& cmd)
{
    auto* depInfo = getDependencyInfo(cmd.source_id);
    if (depInfo == nullptr || !depInfo->dependency) {
        return TimeProcessingResult::NOT_PROCESSED;
    }
    return processMessage(cmd, *depInfo);
}